

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

off_t my_netread(int fd,void *buf,off_t len)

{
  int iVar1;
  ssize_t sVar2;
  long local_38;
  off_t l;
  off_t curr;
  off_t rest;
  off_t len_local;
  void *buf_local;
  int fd_local;
  
  local_38 = 0;
  curr = len;
  while (((curr != 0 && (iVar1 = socket_wait(fd,1), 0 < iVar1)) &&
         (sVar2 = read(fd,(void *)((long)buf + local_38),curr), sVar2 != 0))) {
    local_38 = sVar2 + local_38;
    curr = curr - sVar2;
  }
  return local_38;
}

Assistant:

static off_t my_netread(int fd, void *buf, off_t len)
{
	off_t rest = len, curr, l = 0;
	/* recv() and read() may not read the required length of data with
	 * one call. They have to be called repeatedly. */
	while (rest) {
		if (socket_wait(fd, 1) <= 0) break; // socket is not ready for reading
		curr = netread(fd, (void*)((char*)buf + l), rest);
		/* According to the glibc manual, section 13.2, a zero returned
		 * value indicates end-of-file (EOF), which should mean that
		 * read() will not return zero if EOF has not been met but data
		 * are not immediately available. */
		if (curr == 0) break;
		l += curr; rest -= curr;
	}
	return l;
}